

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_file_sink-inl.h
# Opt level: O3

void __thiscall
spdlog::sinks::rotating_file_sink<std::mutex>::rotate_(rotating_file_sink<std::mutex> *this)

{
  size_t index;
  bool bVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  int *piVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  size_t index_00;
  int in_ESI;
  file_helper *this_00;
  filename_t target;
  filename_t src;
  filename_t local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  filename_t local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->file_helper_;
  details::file_helper::close(this_00,in_ESI);
  if (this->max_files_ != 0) {
    index_00 = this->max_files_;
    do {
      index = index_00 - 1;
      calc_filename(&local_d0,&this->base_filename_,index);
      bVar1 = details::os::path_exists(&local_d0);
      if (bVar1) {
        calc_filename(&local_110,&this->base_filename_,index_00);
        details::os::remove((char *)&local_110);
        iVar2 = details::os::rename((char *)&local_d0,(char *)&local_110);
        if (iVar2 != 0) {
          details::os::sleep_for_millis(100);
          details::os::remove((char *)&local_110);
          iVar2 = details::os::rename((char *)&local_d0,(char *)&local_110);
          if (iVar2 != 0) {
            details::file_helper::reopen(this_00,true);
            this->current_size_ = 0;
            details::os::filename_to_str(&local_90,&local_d0);
            std::operator+(&local_70,"rotating_file_sink: failed renaming ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_90);
            pbVar3 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                               (&local_70," to ");
            local_f0._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
            paVar5 = &pbVar3->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p == paVar5) {
              local_f0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
              local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
              local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            }
            else {
              local_f0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
            }
            local_f0._M_string_length = pbVar3->_M_string_length;
            (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
            pbVar3->_M_string_length = 0;
            (pbVar3->field_2)._M_local_buf[0] = '\0';
            details::os::filename_to_str(&local_b0,&local_110);
            std::operator+(&local_50,&local_f0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_b0);
            piVar4 = __errno_location();
            throw_spdlog_ex((string *)&local_50,*piVar4);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      index_00 = index;
    } while (index != 0);
  }
  details::file_helper::reopen(this_00,true);
  return;
}

Assistant:

SPDLOG_INLINE void rotating_file_sink<Mutex>::rotate_() {
    using details::os::filename_to_str;
    using details::os::path_exists;

    file_helper_.close();
    for (auto i = max_files_; i > 0; --i) {
        filename_t src = calc_filename(base_filename_, i - 1);
        if (!path_exists(src)) {
            continue;
        }
        filename_t target = calc_filename(base_filename_, i);

        if (!rename_file_(src, target)) {
            // if failed try again after a small delay.
            // this is a workaround to a windows issue, where very high rotation
            // rates can cause the rename to fail with permission denied (because of antivirus?).
            details::os::sleep_for_millis(100);
            if (!rename_file_(src, target)) {
                file_helper_.reopen(
                    true);  // truncate the log file anyway to prevent it to grow beyond its limit!
                current_size_ = 0;
                throw_spdlog_ex("rotating_file_sink: failed renaming " + filename_to_str(src) +
                                    " to " + filename_to_str(target),
                                errno);
            }
        }
    }
    file_helper_.reopen(true);
}